

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O0

int unlink_ps_lock(ll_head *q_head,ll_elem *p,ll_elem *expect_s)

{
  bool bVar1;
  ll_elem *ptr;
  ll_elem *plVar2;
  ll_elem *plVar3;
  ll_elem *plVar4;
  bool bVar5;
  ll_elem *local_50;
  int clear_deref;
  ll_elem *ps;
  ll_elem *expect_s_local;
  ll_elem *p_local;
  ll_head *q_head_local;
  
  bVar1 = false;
  ptr = ptr_clear(p);
  plVar2 = ptr_clear(expect_s);
  do {
    local_50 = (ll_elem *)ptr->succ;
    do {
      LOCK();
      plVar4 = (ll_elem *)ptr->succ;
      bVar5 = local_50 == plVar4;
      if (bVar5) {
        ptr->succ = (ulong)local_50 | 1;
        plVar4 = local_50;
      }
      UNLOCK();
      local_50 = plVar4;
    } while (!bVar5);
    if (((ulong)plVar4 & 1) == 0) {
      bVar1 = true;
    }
    bVar5 = false;
    if (!bVar1) {
      plVar3 = ptr_clear(plVar4);
      bVar5 = plVar3 == plVar2;
    }
  } while (bVar5);
  plVar4 = ptr_clear(plVar4);
  if (plVar4 == plVar2) {
    if (!bVar1) {
      __assert_fail("clear_deref",
                    "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",
                    0x24f,"int unlink_ps_lock(struct ll_head *, struct ll_elem *, struct ll_elem *)"
                   );
    }
    q_head_local._4_4_ = 1;
  }
  else {
    if (bVar1) {
      ptr_clear_deref(&ptr->succ);
    }
    q_head_local._4_4_ = 0;
  }
  return q_head_local._4_4_;
}

Assistant:

static int
unlink_ps_lock(struct ll_head *q_head, struct ll_elem *p,
    struct ll_elem *expect_s)
{
	struct ll_elem	*ps;
	int		 clear_deref = 0;

	/* Clear arguments. */
	p = ptr_clear(p);
	expect_s = ptr_clear(expect_s);

	/* Acquire deref, canceling once p->succ changes. */
	do {
		ps = (struct ll_elem*)atomic_fetch_or_explicit(&p->succ, DEREF,
		    memory_order_acquire);
		if ((uintptr_t)ps & DEREF)
			SPINWAIT();
		else
			clear_deref = 1;
	} while (!clear_deref && ptr_clear(ps) == expect_s);

	/* Test reason for cancelation. */
	if (ptr_clear(ps) == expect_s) {
		assert(clear_deref);
		return 1;
	}

	/* Undo deref acquisition. */
	if (clear_deref)
		ptr_clear_deref(&p->succ);

	return 0;
}